

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O3

int blake2sp_init_key(blake2sp_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  blake2sp_state *S_00;
  long lVar3;
  uint8_t block [64];
  blake2s_param local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar2 = -1;
  if ((0xffffffffffffffdf < outlen - 0x21) &&
     (0xffffffffffffffdf < keylen - 0x21 && key != (void *)0x0)) {
    memset(S->buf,0,0x208);
    S->outlen = outlen;
    local_78.fanout = '\b';
    local_78.depth = '\x02';
    local_78.leaf_length = 0;
    local_78.node_offset = 0;
    local_78.xof_length._0_1_ = 0;
    local_78._13_2_ = 0x100;
    local_78.inner_length = ' ';
    local_78.salt[0] = '\0';
    local_78.salt[1] = '\0';
    local_78.salt[2] = '\0';
    local_78.salt[3] = '\0';
    local_78.salt[4] = '\0';
    local_78.salt[5] = '\0';
    local_78.salt[6] = '\0';
    local_78.salt[7] = '\0';
    local_78.personal[0] = '\0';
    local_78.personal[1] = '\0';
    local_78.personal[2] = '\0';
    local_78.personal[3] = '\0';
    local_78.personal[4] = '\0';
    local_78.personal[5] = '\0';
    local_78.personal[6] = '\0';
    local_78.personal[7] = '\0';
    local_78.digest_length = (uint8_t)outlen;
    local_78.key_length = (uint8_t)keylen;
    iVar1 = blake2s_init_param(S->R,&local_78);
    if (-1 < iVar1) {
      lVar3 = 0;
      S_00 = S;
      do {
        local_78.fanout = '\b';
        local_78.depth = '\x02';
        local_78.leaf_length = 0;
        local_78.node_offset = (uint32_t)(byte)lVar3;
        local_78.xof_length._0_1_ = 0;
        local_78._13_2_ = 0;
        local_78.inner_length = 0x20;
        local_78.salt[0] = '\0';
        local_78.salt[1] = '\0';
        local_78.salt[2] = '\0';
        local_78.salt[3] = '\0';
        local_78.salt[4] = '\0';
        local_78.salt[5] = '\0';
        local_78.salt[6] = '\0';
        local_78.salt[7] = '\0';
        local_78.personal[0] = '\0';
        local_78.personal[1] = '\0';
        local_78.personal[2] = '\0';
        local_78.personal[3] = '\0';
        local_78.personal[4] = '\0';
        local_78.personal[5] = '\0';
        local_78.personal[6] = '\0';
        local_78.personal[7] = '\0';
        local_78.digest_length = (uint8_t)outlen;
        local_78.key_length = (uint8_t)keylen;
        iVar2 = blake2s_init_param((blake2s_state *)S_00,&local_78);
        S_00->S[0][0].outlen = (ulong)local_78.inner_length;
        if (iVar2 < 0) {
          return -1;
        }
        lVar3 = lVar3 + 1;
        S_00 = (blake2sp_state *)(S_00->S + 1);
      } while (lVar3 != 8);
      S->R[0].last_node = '\x01';
      S->S[7][0].last_node = '\x01';
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_78.salt[0] = '\0';
      local_78.salt[1] = '\0';
      local_78.salt[2] = '\0';
      local_78.salt[3] = '\0';
      local_78.salt[4] = '\0';
      local_78.salt[5] = '\0';
      local_78.salt[6] = '\0';
      local_78.salt[7] = '\0';
      local_78.personal[0] = '\0';
      local_78.personal[1] = '\0';
      local_78.personal[2] = '\0';
      local_78.personal[3] = '\0';
      local_78.personal[4] = '\0';
      local_78.personal[5] = '\0';
      local_78.personal[6] = '\0';
      local_78.personal[7] = '\0';
      local_78.digest_length = '\0';
      local_78.key_length = '\0';
      local_78.fanout = '\0';
      local_78.depth = '\0';
      local_78.leaf_length = 0;
      local_78.node_offset = 0;
      local_78.xof_length._0_1_ = 0;
      local_78._13_2_ = 0;
      local_78.inner_length = '\0';
      memcpy(&local_78,key,keylen);
      lVar3 = 0;
      do {
        blake2s_update((blake2s_state *)((long)S->S[0][0].h + lVar3),&local_78,0x40);
        lVar3 = lVar3 + 0x88;
      } while (lVar3 != 0x440);
      iVar2 = 0;
      memset(&local_78,0,0x40);
    }
  }
  return iVar2;
}

Assistant:

int blake2sp_init_key( blake2sp_state *S, size_t outlen, const void *key, size_t keylen )
{
  size_t i;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( !key || !keylen || keylen > BLAKE2S_KEYBYTES ) return -1;

  memset( S->buf, 0, sizeof( S->buf ) );
  S->buflen = 0;
  S->outlen = outlen;

  if( blake2sp_init_root( S->R, outlen, keylen ) < 0 )
    return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S->S[i], outlen, keylen, (uint32_t)i ) < 0 ) return -1;

  S->R->last_node = 1;
  S->S[PARALLELISM_DEGREE - 1]->last_node = 1;
  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S->S[i], block, BLAKE2S_BLOCKBYTES );

    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}